

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O1

bool AddLocal(CService *addr_,int nScore)

{
  long lVar1;
  bool bVar2;
  uint16_t uVar3;
  Network net;
  _Rb_tree_iterator<std::pair<const_CNetAddr,_LocalServiceInfo>_> _Var4;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view source_file;
  pair<std::_Rb_tree_iterator<std::pair<const_CNetAddr,_LocalServiceInfo>_>,_bool> pVar5;
  LocalServiceInfo local_68;
  int nScore_local;
  UniqueLock<GlobalMutex> criticalblock19;
  undefined1 local_48 [16];
  CService addr;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  nScore_local = nScore;
  MaybeFlipIPv6toCJDNS(&addr,addr_);
  bVar2 = CNetAddr::IsRoutable(&addr.super_CNetAddr);
  if ((bVar2) && ((fDiscover != false || (3 < nScore_local)))) {
    net = CNetAddr::GetNetwork(&addr.super_CNetAddr);
    bVar2 = ReachableNets::Contains(&g_reachable_nets,net);
    if (bVar2) {
      CService::ToStringAddrPort_abi_cxx11_((string *)&criticalblock19,&addr);
      logging_function._M_str = "AddLocal";
      logging_function._M_len = 8;
      source_file._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp"
      ;
      source_file._M_len = 0x57;
      LogPrintFormatInternal<std::__cxx11::string,int>
                (logging_function,source_file,0x119,ALL,Info,(ConstevalFormatString<2U>)0x7e594c,
                 (string *)&criticalblock19,&nScore_local);
      if (criticalblock19.super_unique_lock._M_device != (mutex_type *)local_48) {
        operator_delete(criticalblock19.super_unique_lock._M_device,local_48._0_8_ + 1);
      }
      criticalblock19.super_unique_lock._M_device = (mutex_type *)&g_maplocalhost_mutex;
      criticalblock19.super_unique_lock._M_owns = false;
      std::unique_lock<std::mutex>::lock(&criticalblock19.super_unique_lock);
      local_68.nScore = 0;
      local_68.nPort = 0;
      local_68._6_2_ = 0;
      pVar5 = std::
              _Rb_tree<CNetAddr,std::pair<CNetAddr_const,LocalServiceInfo>,std::_Select1st<std::pair<CNetAddr_const,LocalServiceInfo>>,std::less<CNetAddr>,std::allocator<std::pair<CNetAddr_const,LocalServiceInfo>>>
              ::_M_emplace_unique<CService&,LocalServiceInfo>
                        ((_Rb_tree<CNetAddr,std::pair<CNetAddr_const,LocalServiceInfo>,std::_Select1st<std::pair<CNetAddr_const,LocalServiceInfo>>,std::less<CNetAddr>,std::allocator<std::pair<CNetAddr_const,LocalServiceInfo>>>
                          *)&mapLocalHost,&addr,&local_68);
      _Var4 = pVar5.first._M_node;
      if ((((undefined1  [16])pVar5 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
         ((int)_Var4._M_node[2]._M_color <= nScore_local)) {
        _Var4._M_node[2]._M_color = (uint)(byte)(pVar5.second ^ 1) + nScore_local;
        uVar3 = CService::GetPort(&addr);
        *(uint16_t *)&_Var4._M_node[2].field_0x4 = uVar3;
      }
      std::unique_lock<std::mutex>::~unique_lock(&criticalblock19.super_unique_lock);
      bVar2 = true;
      goto LAB_0019de93;
    }
  }
  bVar2 = false;
LAB_0019de93:
  if (0x10 < addr.super_CNetAddr.m_addr._size) {
    free(addr.super_CNetAddr.m_addr._union.indirect_contents.indirect);
    addr.super_CNetAddr.m_addr._union.indirect_contents.indirect = (char *)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool AddLocal(const CService& addr_, int nScore)
{
    CService addr{MaybeFlipIPv6toCJDNS(addr_)};

    if (!addr.IsRoutable())
        return false;

    if (!fDiscover && nScore < LOCAL_MANUAL)
        return false;

    if (!g_reachable_nets.Contains(addr))
        return false;

    LogPrintf("AddLocal(%s,%i)\n", addr.ToStringAddrPort(), nScore);

    {
        LOCK(g_maplocalhost_mutex);
        const auto [it, is_newly_added] = mapLocalHost.emplace(addr, LocalServiceInfo());
        LocalServiceInfo &info = it->second;
        if (is_newly_added || nScore >= info.nScore) {
            info.nScore = nScore + (is_newly_added ? 0 : 1);
            info.nPort = addr.GetPort();
        }
    }

    return true;
}